

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogBegin(ImGuiLogType type,int auto_open_depth)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int local_24;
  ImGuiWindow *window;
  ImGuiContext *g;
  int auto_open_depth_local;
  ImGuiLogType type_local;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((GImGui->LogEnabled & 1U) != 0) {
    __assert_fail("g.LogEnabled == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x244e,"void ImGui::LogBegin(ImGuiLogType, int)");
  }
  if (GImGui->LogFile != (ImFileHandle)0x0) {
    __assert_fail("g.LogFile == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x244f,"void ImGui::LogBegin(ImGuiLogType, int)");
  }
  bVar3 = ImGuiTextBuffer::empty(&GImGui->LogBuffer);
  if (bVar3) {
    pIVar2->LogEnabled = true;
    pIVar2->LogType = type;
    pIVar2->LogDepthRef = (pIVar1->DC).TreeDepth;
    local_24 = auto_open_depth;
    if (auto_open_depth < 0) {
      local_24 = pIVar2->LogDepthToExpandDefault;
    }
    pIVar2->LogDepthToExpand = local_24;
    pIVar2->LogLinePosY = 3.4028235e+38;
    pIVar2->LogLineFirstItem = true;
    return;
  }
  __assert_fail("g.LogBuffer.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                ,0x2450,"void ImGui::LogBegin(ImGuiLogType, int)");
}

Assistant:

void ImGui::LogBegin(ImGuiLogType type, int auto_open_depth)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.LogEnabled == false);
    IM_ASSERT(g.LogFile == NULL);
    IM_ASSERT(g.LogBuffer.empty());
    g.LogEnabled = true;
    g.LogType = type;
    g.LogDepthRef = window->DC.TreeDepth;
    g.LogDepthToExpand = ((auto_open_depth >= 0) ? auto_open_depth : g.LogDepthToExpandDefault);
    g.LogLinePosY = FLT_MAX;
    g.LogLineFirstItem = true;
}